

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O1

curi_status
parse_segment(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
             int notEmpty)

{
  size_t sVar1;
  _func_int_void_ptr_char_ptr_size_t *callback;
  curi_status cVar2;
  int iVar3;
  curi_settings *pcVar4;
  size_t strLen;
  void *pvVar5;
  size_t local_40;
  void *local_38;
  
  sVar1 = *offset;
  pcVar4 = settings;
  pvVar5 = userData;
  if (notEmpty == 0) {
    cVar2 = curi_status_success;
  }
  else {
    cVar2 = parse_pchar(uri,len,offset,settings,userData);
  }
  if (cVar2 == curi_status_success) {
    local_40 = *offset;
    local_38 = userData;
    cVar2 = parse_pchar(uri,len,&local_40,pcVar4,pvVar5);
    if (cVar2 == curi_status_success) {
      do {
        *offset = local_40;
        cVar2 = parse_pchar(uri,len,&local_40,pcVar4,pvVar5);
      } while (cVar2 == curi_status_success);
    }
    cVar2 = curi_status_success;
    userData = local_38;
  }
  if (cVar2 == curi_status_success) {
    strLen = *offset - sVar1;
    callback = settings->path_segment_callback;
    if (settings->url_decode != 0) {
      cVar2 = handle_str_callback_url_decoded(callback,uri + sVar1,strLen,settings,userData);
      return cVar2;
    }
    cVar2 = curi_status_success;
    if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && *offset != sVar1) {
      iVar3 = (*callback)(userData,uri + sVar1,strLen);
      cVar2 = (curi_status)(iVar3 == 0);
    }
  }
  return cVar2;
}

Assistant:

static curi_status parse_segment(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int notEmpty)
{
    // segment = pchars
    // segment-not-empty = pchar pchars
    const size_t initialOffset = *offset;
    curi_status status = curi_status_success;

    if (notEmpty && status == curi_status_success)
        status = parse_pchar(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_pchars(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_path_segment(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}